

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O2

void __thiscall ObserverManager_SharedPtr_Test::TestBody(ObserverManager_SharedPtr_Test *this)

{
  char *message;
  AssertHelper AStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  AssertionResult gtest_ar;
  shared_ptr<B> b;
  shared_ptr<A> a;
  stringstream out;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  std::make_shared<A,std::__cxx11::stringstream&,char_const(&)[4]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&a,
             (char (*) [4])&out);
  ObserverManager::subscribe<FooBarProtocol,A>
            (a.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::make_shared<B,std::__cxx11::stringstream&>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&b);
  ObserverManager::subscribe<FooBarProtocol,B>
            (b.super___shared_ptr<B,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__shared_ptr<FooBarProtocol,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<B,void>
            ((__shared_ptr<FooBarProtocol,(__gnu_cxx::_Lock_policy)2> *)&local_1e0,
             &b.super___shared_ptr<B,_(__gnu_cxx::_Lock_policy)2>);
  ObserverManager::unsubscribe<FooBarProtocol>((FooBarProtocol *)local_1e0._M_dataplus._M_p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e0._M_string_length);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Tic Tac \"","out.str()",(char (*) [9])0x14b0e6,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0xb0,message);
    testing::internal::AssertHelper::operator=(&AStack_1e8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&b.super___shared_ptr<B,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&a.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return;
}

Assistant:

TEST(ObserverManager, SharedPtr)  {
    std::stringstream out;

    auto a = std::make_shared<A>(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a);

    auto b = std::make_shared<B>(out);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&FooBarProtocol::foo);

    ObserverManager::unsubscribe<FooBarProtocol>(b);

    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    EXPECT_EQ("Tic Tac ", out.str());
}